

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void AGSSock::Socket_Close(Socket *sock)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  timeval timeout;
  fd_set read;
  timeval local_98;
  fd_set local_88;
  
  if (sock->type == 1) {
    shutdown(sock->id,1);
    local_98.tv_sec = 0;
    local_98.tv_usec = 500;
    local_88.fds_bits[0] = 0;
    local_88.fds_bits[1] = 0;
    local_88.fds_bits[2] = 0;
    local_88.fds_bits[3] = 0;
    local_88.fds_bits[4] = 0;
    local_88.fds_bits[5] = 0;
    local_88.fds_bits[6] = 0;
    local_88.fds_bits[7] = 0;
    local_88.fds_bits[8] = 0;
    local_88.fds_bits[9] = 0;
    local_88.fds_bits[10] = 0;
    local_88.fds_bits[0xb] = 0;
    local_88.fds_bits[0xc] = 0;
    local_88.fds_bits[0xd] = 0;
    local_88.fds_bits[0xe] = 0;
    local_88.fds_bits[0xf] = 0;
    iVar2 = sock->id;
    iVar1 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    local_88.fds_bits[iVar1 >> 6] =
         local_88.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
    iVar2 = select(iVar2 + 1,&local_88,(fd_set *)0x0,(fd_set *)0x0,&local_98);
    if (0 < iVar2) {
      return;
    }
  }
  Pool::remove(pool,(char *)sock);
  close(sock->id);
  sock->id = -1;
  piVar3 = __errno_location();
  sock->error = *piVar3;
  return;
}

Assistant:

void Socket_Close(Socket *sock)
{
	if (sock->type == SOCK_STREAM)
	{
		// Graceful shutdown, the poolthread will detect if it succeeded.
		shutdown(sock->id, SD_SEND);
		
		// Wait for a response to prevent race conditions
		fd_set read;
		timeval timeout = {0, 500}; // Half a second fudge time
		FD_ZERO(&read);
		
		FD_SET(sock->id, &read);
		if (select(sock->id + 1, &read, nullptr, nullptr, &timeout) > 0)
			return;
			
		// Select failed or timeout: we force close
	}
	
	// Invalidate socket
	pool->remove(sock);
	closesocket(sock->id);
	sock->id = INVALID_SOCKET;
	sock->error = GET_ERROR();
}